

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O0

qpdflogger_handle qpdflogger_default_logger(void)

{
  _qpdflogger_handle *this;
  shared_ptr<QPDFLogger> local_18;
  
  this = (_qpdflogger_handle *)operator_new(0x10);
  QPDFLogger::defaultLogger();
  _qpdflogger_handle::_qpdflogger_handle(this,&local_18);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_18);
  return this;
}

Assistant:

qpdflogger_handle
qpdflogger_default_logger()
{
    return new _qpdflogger_handle(QPDFLogger::defaultLogger());
}